

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.h
# Opt level: O0

void __thiscall
Js::DynamicTypeHandler::ShareTypeHandler(DynamicTypeHandler *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined4 *puVar5;
  ScriptContext *scriptContext_local;
  DynamicTypeHandler *this_local;
  
  iVar4 = (*this->_vptr_DynamicTypeHandler[5])();
  if (iVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0x16e,"(IsSharable())","IsSharable()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = GetMayBecomeShared(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0x16f,"(GetMayBecomeShared())","GetMayBecomeShared()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  LockTypeHandler(this);
  bVar3 = GetFlags(this);
  if ((bVar3 & 0x10) == 0) {
    (*this->_vptr_DynamicTypeHandler[0x57])(this,scriptContext);
  }
  SetFlags(this,'\x10');
  return;
}

Assistant:

void ShareTypeHandler(ScriptContext* scriptContext)
        {
            Assert(IsSharable());
            Assert(GetMayBecomeShared());
            LockTypeHandler();
#if ENABLE_FIXED_FIELDS
            if ((GetFlags() & IsSharedFlag) == 0)
            {
                DoShareTypeHandler(scriptContext);
            }
#endif
            SetFlags(IsSharedFlag);
        }